

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_ActivateEvent
               (FACTSoundInstance *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst,uint32_t elapsed)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  short *in_RCX;
  long in_RDX;
  long *in_RDI;
  int *in_R8;
  uint in_R9D;
  double dVar4;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint8_t skipLoopCheck;
  float svResult;
  uint8_t i;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  uint16_t in_stack_ffffffffffffffae;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar5;
  undefined4 in_stack_ffffffffffffffb4;
  float local_34;
  byte local_2d;
  
  bVar1 = false;
  if (*in_RCX == 0) {
    if ((*(byte *)(in_RCX + 4) & 2) == 0) {
      FACT_INTERNAL_StopTrack
                ((FACTTrack *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (FACTTrackInstance *)
                 CONCAT26(in_stack_ffffffffffffffae,
                          CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),'\0');
    }
    else if (((*(byte *)(in_RCX + 4) & 1) == 0) &&
            ((*(short *)(*(long *)(*(long *)in_RDI[6] + 0x48) +
                         (ulong)*(ushort *)(in_RDI[6] + 0x12) * 0x14 + 0x10) != 0 ||
             (*(int *)(in_RDI[6] + 0x58) != 0)))) {
      if (*(short *)(*(long *)(*(long *)in_RDI[6] + 0x48) +
                     (ulong)*(ushort *)(in_RDI[6] + 0x12) * 0x14 + 0x10) == 0) {
        if (*(int *)(in_RDI[6] + 0x58) == 0) {
          *(uint *)(in_RDI[6] + 0x3c) = *(uint *)(in_RDI[6] + 0x3c) | 0x10;
        }
        else {
          FACT_INTERNAL_BeginReleaseRPC
                    ((FACTSoundInstance *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffae);
        }
      }
      else {
        FACT_INTERNAL_BeginFadeOut
                  ((FACTSoundInstance *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffae);
      }
    }
    else {
      for (local_2d = 0; local_2d < *(byte *)(*in_RDI + 0xb); local_2d = local_2d + 1) {
        FACT_INTERNAL_StopTrack
                  ((FACTTrack *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (FACTTrackInstance *)
                   CONCAT26(in_stack_ffffffffffffffae,
                            CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),'\0');
      }
    }
  }
  else if ((((*in_RCX == 1) || (*in_RCX == 3)) || (*in_RCX == 4)) || (*in_RCX == 6)) {
    do {
      if (*(long *)(in_RDX + 0x28) == 0) goto LAB_0011aa83;
      iVar3 = SDL_ReportAssertion(&FACT_INTERNAL_ActivateEvent::sdl_assert_data,
                                  "FACT_INTERNAL_ActivateEvent",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                  ,0x530);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
LAB_0011aa83:
    do {
      if (*(long *)(in_RDX + 0x40) != 0) goto LAB_0011aad0;
      iVar3 = SDL_ReportAssertion(&FACT_INTERNAL_ActivateEvent::sdl_assert_data_1,
                                  "FACT_INTERNAL_ActivateEvent",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                  ,0x531);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
LAB_0011aad0:
    SDL_memcpy(in_RDX + 0x28,in_RDX + 0x40,0x18);
    *(undefined8 *)(in_RDX + 0x40) = 0;
    FACTWave_Play((FACTWave *)
                  CONCAT26(in_stack_ffffffffffffffae,
                           CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)));
  }
  else if (((*in_RCX == 7) || (*in_RCX == 0x10)) || ((*in_RCX == 8 || (*in_RCX == 0x11)))) {
    if ((*(byte *)(in_RCX + 4) & 1) == 0) {
      if ((*(byte *)(in_RCX + 8) & 4) == 0) {
        if ((*(byte *)(in_RCX + 8) & 8) == 0) {
          local_34 = 0.0;
          do {
            iVar3 = SDL_ReportAssertion(&FACT_INTERNAL_ActivateEvent::sdl_assert_data_2,
                                        "FACT_INTERNAL_ActivateEvent",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                        ,0x566);
          } while (iVar3 == 0);
          if (iVar3 == 1) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        else {
          local_34 = *(float *)(in_RCX + 10);
          dVar4 = stb_frand();
          local_34 = (float)dVar4 * (*(float *)(in_RCX + 0xc) - *(float *)(in_RCX + 10)) + local_34;
        }
      }
      else {
        local_34 = *(float *)(in_RCX + 10);
      }
      if ((*(byte *)(in_RCX + 8) & 1) == 0) {
        in_R8[2] = (int)local_34;
      }
      else if ((*in_RCX == 7) || (*in_RCX == 0x10)) {
        in_R8[2] = (int)(*(float *)(in_RDX + 0x1c) + local_34);
      }
      else {
        in_R8[2] = (int)(*(float *)(in_RDX + 0x20) + local_34);
      }
    }
    else {
      bVar1 = in_R9D <= *in_R8 + (uint)(ushort)in_RCX[0xe];
      if ((float)(in_R9D - *in_R8) / (float)(ushort)in_RCX[0xe] <= 1.0) {
        if (0.0 <= (float)(in_R9D - *in_R8) / (float)(ushort)in_RCX[0xe]) {
          fVar5 = (float)(in_R9D - *in_R8) / (float)(ushort)in_RCX[0xe];
        }
        else {
          fVar5 = 0.0;
        }
      }
      else {
        fVar5 = 1.0;
      }
      in_R8[2] = (int)(((((*(float *)(in_RCX + 10) * (float)(ushort)in_RCX[0xe]) / 1000.0) * 10.0 +
                        *(float *)(in_RCX + 8)) - *(float *)(in_RCX + 8)) * fVar5 +
                      *(float *)(in_RCX + 8));
    }
    if ((*in_RCX == 7) || (*in_RCX == 0x10)) {
      *(int *)(in_RDX + 0x1c) = in_R8[2];
    }
    else {
      *(int *)(in_RDX + 0x20) = in_R8[2];
    }
    if (bVar1) {
      return;
    }
    if ((short)in_R8[1] != 0) {
      if (((short)in_R8[1] != 0xff) && ((short)in_R8[1] != -1)) {
        *(short *)(in_R8 + 1) = (short)in_R8[1] + -1;
      }
      *in_R8 = (uint)(ushort)in_RCX[6] + *in_R8;
      return;
    }
  }
  else if ((*in_RCX == 9) || (*in_RCX == 0x12)) {
    if ((short)in_R8[1] != 0) {
      if ((short)in_R8[1] != 0xff) {
        *(short *)(in_R8 + 1) = (short)in_R8[1] + -1;
      }
      *in_R8 = (uint)(ushort)in_RCX[7] + *in_R8;
      return;
    }
  }
  else {
    do {
      iVar3 = SDL_ReportAssertion(&FACT_INTERNAL_ActivateEvent::sdl_assert_data_3,
                                  "FACT_INTERNAL_ActivateEvent",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT_internal.c"
                                  ,0x5ab);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  *(undefined1 *)((long)in_R8 + 6) = 1;
  return;
}

Assistant:

void FACT_INTERNAL_ActivateEvent(
	FACTSoundInstance *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst,
	uint32_t elapsed
) {
	uint8_t i;
	float svResult;
	uint8_t skipLoopCheck = 0;

	/* STOP */
	if (evt->type == FACTEVENT_STOP)
	{
		/* Stop Cue */
		if (evt->stop.flags & 0x02)
		{
			if (	evt->stop.flags & 0x01 ||
				(	sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS == 0 &&
					sound->parentCue->maxRpcReleaseTime == 0	)	)
			{
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					FACT_INTERNAL_StopTrack(
						&sound->sound->tracks[i],
						&sound->tracks[i],
						1
					);
				}
			}
			else
			{
				if (sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS > 0)
				{
					FACT_INTERNAL_BeginFadeOut(
						sound,
						sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS
					);
				}
				else if (sound->parentCue->maxRpcReleaseTime > 0)
				{
					FACT_INTERNAL_BeginReleaseRPC(
						sound,
						sound->parentCue->maxRpcReleaseTime
					);
				}
				else
				{
					/* Pretty sure this doesn't happen, but just in case? */
					sound->parentCue->state |= FACT_STATE_STOPPING;
				}
			}
		}

		/* Stop track */
		else
		{
			FACT_INTERNAL_StopTrack(
				track,
				trackInst,
				evt->stop.flags & 0x01
			);
		}
	}

	/* PLAYWAVE */
	else if (	evt->type == FACTEVENT_PLAYWAVE ||
			evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
			evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
			evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
	{
		FAudio_assert(trackInst->activeWave.wave == NULL);
		FAudio_assert(trackInst->upcomingWave.wave != NULL);
		FAudio_memcpy(
			&trackInst->activeWave,
			&trackInst->upcomingWave,
			sizeof(trackInst->activeWave)
		);
		trackInst->upcomingWave.wave = NULL;
		FACTWave_Play(trackInst->activeWave.wave);
	}

	/* SETVALUE */
	else if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING ||
			evt->type == FACTEVENT_VOLUME ||
			evt->type == FACTEVENT_VOLUMEREPEATING	)
	{
		/* Ramp/Equation */
		if (evt->value.settings & 0x01)
		{
			/* FIXME: Incorporate 2nd derivative into the interpolated pitch (slopeDelta) */
			skipLoopCheck = elapsed <= (evtInst->timestamp + evt->value.ramp.duration);
			svResult = (
				evt->value.ramp.initialSlope *
				evt->value.ramp.duration / 1000 *
				10 /* "Slices" */
			) + evt->value.ramp.initialValue;
			svResult = (
				(svResult - evt->value.ramp.initialValue)
			) * FAudio_clamp(
				(float) (elapsed - evtInst->timestamp) / evt->value.ramp.duration,
				0.0f,
				1.0f
			) + evt->value.ramp.initialValue;

			evtInst->value = svResult;
		}
		else
		{
			/* Value/Random */
			if (evt->value.equation.flags & 0x04)
			{
				svResult = evt->value.equation.value1;
			}
			else if (evt->value.equation.flags & 0x08)
			{
				svResult = evt->value.equation.value1 + FACT_INTERNAL_rng() * (
					evt->value.equation.value2 -
					evt->value.equation.value1
				);
			}
			else
			{
				svResult = 0.0f;
				FAudio_assert(0 && "Equation flags?");
			}

			/* Add/Replace */
			if (evt->value.equation.flags & 0x01)
			{
				if(	evt->type == FACTEVENT_PITCH ||
					evt->type == FACTEVENT_PITCHREPEATING	)
				{
					evtInst->value = trackInst->evtPitch + svResult;
				}
				else
				{
					evtInst->value = trackInst->evtVolume + svResult;
				}
			}
			else
			{
				evtInst->value = svResult;
			}
		}

		/* Set the result, finally. */
		if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING	)
		{
			trackInst->evtPitch = evtInst->value;
		}
		else
		{
			trackInst->evtVolume = evtInst->value;
		}

		if (skipLoopCheck)
		{
			return;
		}
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF && evtInst->loopCount != 0xFFFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->value.frequency;
			return;
		}
	}

	/* MARKER */
	else if (	evt->type == FACTEVENT_MARKER ||
			evt->type == FACTEVENT_MARKERREPEATING	)
	{
		/* TODO: FACT_INTERNAL_Marker(evt->marker*) */
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->marker.frequency;
			return;
		}
	}

	/* ??? */
	else
	{
		FAudio_assert(0 && "Unknown event type!");
	}

	/* If we made it here, we're done! */
	evtInst->finished = 1;
}